

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Vec_Int_t * Acb_DeriveWeights(Vec_Int_t *vDivs,Acb_Ntk_t *pNtkF)

{
  int iVar1;
  Vec_Int_t *p;
  int *piVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = vDivs->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar3 = iVar1;
  }
  p->nSize = 0;
  p->nCap = iVar3;
  if (iVar3 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar3 << 2);
  }
  p->pArray = piVar2;
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      iVar1 = vDivs->pArray[lVar4];
      if (((long)iVar1 < 0) || ((pNtkF->vObjWeight).nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(p,(pNtkF->vObjWeight).pArray[iVar1]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vDivs->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Acb_DeriveWeights( Vec_Int_t * vDivs, Acb_Ntk_t * pNtkF )
{
    int i, iDiv;
    Vec_Int_t * vWeights = Vec_IntAlloc( Vec_IntSize(vDivs) );
    Vec_IntForEachEntry( vDivs, iDiv, i )
        Vec_IntPush( vWeights, Vec_IntEntry(&pNtkF->vObjWeight, iDiv) );
    return vWeights;
}